

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestInputStream::TestInputStream
          (TestInputStream *this,ArrayPtr<const_capnp::word> data,bool lazy)

{
  char *pcVar1;
  ArrayPtr<const_char> local_58 [2];
  ArrayPtr<const_char> local_38;
  byte local_21;
  TestInputStream *pTStack_20;
  bool lazy_local;
  TestInputStream *this_local;
  ArrayPtr<const_capnp::word> data_local;
  
  data_local.ptr = (word *)data.size_;
  this_local = (TestInputStream *)data.ptr;
  local_21 = lazy;
  pTStack_20 = this;
  kj::InputStream::InputStream(&this->super_InputStream);
  (this->super_InputStream)._vptr_InputStream = (_func_int **)&PTR__TestInputStream_0058c7e8;
  local_38 = kj::ArrayPtr<const_capnp::word>::asChars((ArrayPtr<const_capnp::word> *)&this_local);
  pcVar1 = kj::ArrayPtr<const_char>::begin(&local_38);
  this->pos = pcVar1;
  local_58[0] = kj::ArrayPtr<const_capnp::word>::asChars((ArrayPtr<const_capnp::word> *)&this_local)
  ;
  pcVar1 = kj::ArrayPtr<const_char>::end(local_58);
  this->end = pcVar1;
  this->lazy = (bool)(local_21 & 1);
  return;
}

Assistant:

TestInputStream(kj::ArrayPtr<const word> data, bool lazy)
      : pos(data.asChars().begin()),
        end(data.asChars().end()),
        lazy(lazy) {}